

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconv_utils.cpp
# Opt level: O0

int __thiscall MeCab::Iconv::open(Iconv *this,char *__file,int __oflag,...)

{
  char *to_local;
  char *from_local;
  Iconv *this_local;
  
  this->ic_ = 0;
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
}

Assistant:

bool Iconv::open(const char* from, const char* to) {
  ic_ = 0;
#if defined HAVE_ICONV
  const char *from2 = decode_charset_iconv(from);
  const char *to2 = decode_charset_iconv(to);
  if (std::strcmp(from2, to2) == 0) {
    return true;
  }
  ic_ = 0;
  ic_ = iconv_open(to2, from2);
  if (ic_ == (iconv_t)(-1)) {
    ic_ = 0;
    return false;
  }
#else
/* for Open JTalk
#if defined(_WIN32) && !defined(__CYGWIN__)
*/
#ifdef HAVE_WINDOWS_H /* for Open JTalk */
  from_cp_ = decode_charset_win32(from);
  to_cp_ = decode_charset_win32(to);
  if (from_cp_ == to_cp_) {
    return true;
  }
  ic_ = from_cp_;
#else
/* for Open JTalk
  std::cerr << "iconv_open is not supported" << std::endl;
*/
#endif
#endif

  return true;
}